

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAxisSweep3Internal.h
# Opt level: O3

void __thiscall
cbtAxisSweep3Internal<unsigned_short>::rayTest
          (cbtAxisSweep3Internal<unsigned_short> *this,cbtVector3 *rayFrom,cbtVector3 *rayTo,
          cbtBroadphaseRayCallback *rayCallback,cbtVector3 *aabbMin,cbtVector3 *aabbMax)

{
  ushort uVar1;
  uint uVar2;
  ulong uVar3;
  
  if (this->m_raycastAccelerator != (cbtDbvtBroadphase *)0x0) {
    (*(this->m_raycastAccelerator->super_cbtBroadphaseInterface)._vptr_cbtBroadphaseInterface[6])();
    return;
  }
  uVar1 = this->m_numHandles;
  if (uVar1 != 0) {
    uVar3 = 1;
    do {
      uVar3 = uVar3 & 0xffff;
      if ((this->m_pEdges[0][uVar3].m_pos & 1) != 0) {
        (*(rayCallback->super_cbtBroadphaseAabbCallback)._vptr_cbtBroadphaseAabbCallback[2])
                  (rayCallback,
                   (long)(this->m_pHandles->super_cbtBroadphaseProxy).m_aabbMin.m_floats +
                   ((ulong)((uint)this->m_pEdges[0][uVar3].m_handle * 0x48) - 0x14),rayTo);
        uVar1 = this->m_numHandles;
      }
      uVar2 = (int)uVar3 + 1;
      uVar3 = (ulong)uVar2;
      rayTo = (cbtVector3 *)(ulong)((uint)uVar1 * 2);
    } while ((uVar2 & 0xffff) <= (uint)uVar1 * 2);
  }
  return;
}

Assistant:

void cbtAxisSweep3Internal<BP_FP_INT_TYPE>::rayTest(const cbtVector3& rayFrom, const cbtVector3& rayTo, cbtBroadphaseRayCallback& rayCallback, const cbtVector3& aabbMin, const cbtVector3& aabbMax)
{
	if (m_raycastAccelerator)
	{
		m_raycastAccelerator->rayTest(rayFrom, rayTo, rayCallback, aabbMin, aabbMax);
	}
	else
	{
		//choose axis?
		BP_FP_INT_TYPE axis = 0;
		//for each proxy
		for (BP_FP_INT_TYPE i = 1; i < m_numHandles * 2 + 1; i++)
		{
			if (m_pEdges[axis][i].IsMax())
			{
				rayCallback.process(getHandle(m_pEdges[axis][i].m_handle));
			}
		}
	}
}